

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.hh
# Opt level: O2

bool __thiscall roaring::Roaring64Map::isFull(Roaring64Map *this)

{
  bool bVar1;
  
  if ((this->roarings)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0x100000000) {
    bVar1 = std::
            all_of<std::_Rb_tree_const_iterator<std::pair<unsigned_int_const,roaring::Roaring>>,roaring::Roaring64Map::isFull()const::_lambda(std::pair<unsigned_int_const,roaring::Roaring>const&)_1_>
                      ((this->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                       &(this->roarings)._M_t._M_impl.super__Rb_tree_header);
    return bVar1;
  }
  return false;
}

Assistant:

bool isFull() const {
        // only bother to check if map is fully saturated
        //
        // we put std::numeric_limits<>::max/min in parentheses
        // to avoid a clash with the Windows.h header under Windows
        return roarings.size() ==
                       ((uint64_t)(std::numeric_limits<uint32_t>::max)()) + 1
                   ? std::all_of(roarings.cbegin(), roarings.cend(),
                                 [](const std::pair<const uint32_t, Roaring>
                                        &roaring_map_entry) {
                                     return roaring_map_entry.second.isFull();
                                 })
                   : false;
    }